

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O0

PmError pm_linuxalsa_init(void)

{
  snd_seq_port_info_t *psVar1;
  int iVar2;
  undefined4 uVar3;
  long lVar4;
  size_t sVar5;
  snd_seq_port_info_t *psVar6;
  char *pcVar7;
  void *pvVar8;
  undefined8 uStack_70;
  snd_seq_port_info_t asStack_68 [8];
  ulong local_60;
  char *local_58;
  ulong local_50;
  char *local_48;
  snd_seq_port_info_t *local_40;
  snd_seq_port_info_t *local_38;
  snd_seq_port_info_t *local_30;
  uint local_24;
  snd_seq_port_info_t *psStack_20;
  uint caps;
  snd_seq_port_info_t *pinfo;
  snd_seq_client_info_t *cinfo;
  int err;
  
  uStack_70 = 0x108532;
  cinfo._0_4_ = snd_seq_open(&seq,"default",3,0);
  cinfo._4_4_ = (PmError)cinfo;
  if (~pmNoData < (PmError)cinfo) {
    uStack_70 = 0x10854d;
    lVar4 = snd_seq_client_info_sizeof();
    lVar4 = -(lVar4 + 0xfU & 0xfffffffffffffff0);
    psVar6 = asStack_68 + lVar4;
    local_30 = psVar6;
    pinfo = psVar6;
    *(undefined8 *)(asStack_68 + lVar4 + -8) = 0x108572;
    sVar5 = snd_seq_client_info_sizeof();
    psVar1 = local_30;
    *(undefined8 *)(asStack_68 + lVar4 + -8) = 0x108580;
    memset(psVar1,0,sVar5);
    *(undefined8 *)(asStack_68 + lVar4 + -8) = 0x108587;
    lVar4 = snd_seq_port_info_sizeof();
    psVar6 = psVar6 + -(lVar4 + 0xfU & 0xfffffffffffffff0);
    local_38 = psVar6;
    psStack_20 = psVar6;
    *(undefined8 *)(psVar6 + -8) = 0x1085ac;
    sVar5 = snd_seq_port_info_sizeof();
    psVar1 = local_38;
    *(undefined8 *)(psVar6 + -8) = 0x1085ba;
    memset(psVar1,0,sVar5);
    psVar1 = pinfo;
    *(undefined8 *)(psVar6 + -8) = 0x1085c8;
    snd_seq_client_info_set_client(psVar1,0xffffffff);
    while( true ) {
      psVar1 = pinfo;
      *(undefined8 *)(psVar6 + -8) = 0x1085d8;
      iVar2 = snd_seq_query_next_client(seq,psVar1);
      psVar1 = pinfo;
      if (iVar2 != 0) break;
      local_40 = psStack_20;
      *(undefined8 *)(psVar6 + -8) = 0x1085f2;
      uVar3 = snd_seq_client_info_get_client(psVar1);
      psVar1 = local_40;
      *(undefined8 *)(psVar6 + -8) = 0x1085fd;
      snd_seq_port_info_set_client(psVar1,uVar3);
      psVar1 = psStack_20;
      *(undefined8 *)(psVar6 + -8) = 0x10860b;
      snd_seq_port_info_set_port(psVar1,0xffffffff);
      while( true ) {
        psVar1 = psStack_20;
        *(undefined8 *)(psVar6 + -8) = 0x10861b;
        iVar2 = snd_seq_query_next_port(seq,psVar1);
        psVar1 = psStack_20;
        if (iVar2 != 0) break;
        *(undefined8 *)(psVar6 + -8) = 0x10862d;
        iVar2 = snd_seq_port_info_get_client(psVar1);
        psVar1 = psStack_20;
        if (iVar2 != 0) {
          *(undefined8 *)(psVar6 + -8) = 0x10863d;
          local_24 = snd_seq_port_info_get_capability(psVar1);
          psVar1 = psStack_20;
          if ((local_24 & 0x60) != 0) {
            if ((local_24 & 0x40) != 0) {
              if (pm_default_output_device_id == -1) {
                pm_default_output_device_id = pm_descriptor_index;
              }
              *(undefined8 *)(psVar6 + -8) = 0x10867f;
              pcVar7 = (char *)snd_seq_port_info_get_name(psVar1);
              *(undefined8 *)(psVar6 + -8) = 0x108687;
              local_48 = pm_strdup(pcVar7);
              psVar1 = psStack_20;
              *(undefined8 *)(psVar6 + -8) = 0x108694;
              iVar2 = snd_seq_port_info_get_client(psVar1);
              psVar1 = psStack_20;
              local_50 = (long)iVar2 << 8;
              *(undefined8 *)(psVar6 + -8) = 0x1086a7;
              iVar2 = snd_seq_port_info_get_port(psVar1);
              pcVar7 = local_48;
              pvVar8 = (void *)(local_50 | (long)iVar2);
              *(undefined8 *)(psVar6 + -8) = 0x1086c9;
              pm_add_device("ALSA",pcVar7,0,pvVar8,&pm_linuxalsa_out_dictionary);
            }
            psVar1 = psStack_20;
            if ((local_24 & 0x20) != 0) {
              if (pm_default_input_device_id == -1) {
                pm_default_input_device_id = pm_descriptor_index;
              }
              *(undefined8 *)(psVar6 + -8) = 0x1086fb;
              pcVar7 = (char *)snd_seq_port_info_get_name(psVar1);
              *(undefined8 *)(psVar6 + -8) = 0x108703;
              local_58 = pm_strdup(pcVar7);
              psVar1 = psStack_20;
              *(undefined8 *)(psVar6 + -8) = 0x108710;
              iVar2 = snd_seq_port_info_get_client(psVar1);
              psVar1 = psStack_20;
              local_60 = (long)iVar2 << 8;
              *(undefined8 *)(psVar6 + -8) = 0x108723;
              iVar2 = snd_seq_port_info_get_port(psVar1);
              pcVar7 = local_58;
              pvVar8 = (void *)(local_60 | (long)iVar2);
              *(undefined8 *)(psVar6 + -8) = 0x108748;
              pm_add_device("ALSA",pcVar7,1,pvVar8,&pm_linuxalsa_in_dictionary);
            }
          }
        }
      }
    }
    cinfo._4_4_ = pmNoData;
  }
  return cinfo._4_4_;
}

Assistant:

PmError pm_linuxalsa_init( void )
{
    int  err;
    snd_seq_client_info_t *cinfo;
    snd_seq_port_info_t *pinfo;
    unsigned int caps;

    /* Previously, the last parameter was SND_SEQ_NONBLOCK, but this 
     * would cause messages to be dropped if the ALSA buffer fills up.
     * The correct behavior is for writes to block until there is 
     * room to send all the data. The client should normally allocate
     * a large enough buffer to avoid blocking on output. 
     * Now that blocking is enabled, the seq_event_input() will block
     * if there is no input data. This is not what we want, so must
     * call seq_event_input_pending() to avoid blocking.
     */
    err = snd_seq_open(&seq, "default", SND_SEQ_OPEN_DUPLEX, 0);
    if (err < 0) return err;
    
    snd_seq_client_info_alloca(&cinfo);
    snd_seq_port_info_alloca(&pinfo);

    snd_seq_client_info_set_client(cinfo, -1);
    while (snd_seq_query_next_client(seq, cinfo) == 0) {
        snd_seq_port_info_set_client(pinfo, snd_seq_client_info_get_client(cinfo));
        snd_seq_port_info_set_port(pinfo, -1);
        while (snd_seq_query_next_port(seq, pinfo) == 0) {
            if (snd_seq_port_info_get_client(pinfo) == SND_SEQ_CLIENT_SYSTEM)
                continue; /* ignore Timer and Announce ports on client 0 */
            caps = snd_seq_port_info_get_capability(pinfo);
            if (!(caps & (SND_SEQ_PORT_CAP_SUBS_READ | SND_SEQ_PORT_CAP_SUBS_WRITE)))
                continue; /* ignore if you cannot read or write port */
            if (caps & SND_SEQ_PORT_CAP_SUBS_WRITE) {
                if (pm_default_output_device_id == -1)
                    pm_default_output_device_id = pm_descriptor_index;
                pm_add_device("ALSA",
                              pm_strdup(snd_seq_port_info_get_name(pinfo)),
                              FALSE,
                              MAKE_DESCRIPTOR((uintptr_t)snd_seq_port_info_get_client(pinfo),
                                              snd_seq_port_info_get_port(pinfo)),
                              &pm_linuxalsa_out_dictionary);
            }
            if (caps & SND_SEQ_PORT_CAP_SUBS_READ) {
                if (pm_default_input_device_id == -1)
                    pm_default_input_device_id = pm_descriptor_index;
                pm_add_device("ALSA",
                              pm_strdup(snd_seq_port_info_get_name(pinfo)),
                              TRUE,
                              MAKE_DESCRIPTOR((uintptr_t)snd_seq_port_info_get_client(pinfo),
                                              snd_seq_port_info_get_port(pinfo)),
                              &pm_linuxalsa_in_dictionary);
            }
        }
    }
    return pmNoError;
}